

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O0

bool __thiscall ON_3dmProperties::Read(ON_3dmProperties *this,ON_BinaryArchive *file)

{
  bool bVar1;
  uint archive_3dm_version;
  uint local_2c;
  long lStack_28;
  uint opennurbs_version;
  ON__INT64 value;
  uint tcode;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_3dmProperties *this_local;
  
  _tcode = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Empty);
  value._7_1_ = 1;
  while (value._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                                 (_tcode,(uint *)&value,&stack0xffffffffffffffd8), (bool)value._7_1_
        ) {
    if ((int)value == -0x5fffffda) {
      local_2c = 0;
      if ((0 < lStack_28) && (lStack_28 < 0x100000000)) {
        local_2c = (uint)lStack_28;
      }
      bVar1 = ON_VersionNumberIsValid(local_2c);
      if (!bVar1) {
        archive_3dm_version = ON_BinaryArchive::Archive3dmVersion(_tcode);
        bVar1 = ON_VersionNumberIsYearMonthDateFormat(archive_3dm_version,local_2c);
        if (!bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_properties.cpp"
                     ,0x1cb,"",
                     "ON_3dmProperties::Read - TCODE_PROPERTIES_OPENNURBS_VERSION corrupt value");
          value._7_1_ = 0;
        }
      }
      ON_SetBinaryArchiveOpenNURBSVersion(_tcode,local_2c);
    }
    else if ((int)value == 0x20008021) {
      value._7_1_ = ON_3dmRevisionHistory::Read(&this->m_RevisionHistory,_tcode);
    }
    else if ((int)value == 0x20008022) {
      value._7_1_ = ON_3dmNotes::Read(&this->m_Notes,_tcode);
    }
    else if ((int)value == 0x20008023) {
      value._7_1_ = ON_WindowsBitmap::ReadUncompressed(&this->m_PreviewImage,_tcode);
    }
    else if ((int)value == 0x20008024) {
      value._7_1_ = ON_3dmApplication::Read(&this->m_Application,_tcode);
    }
    else if ((int)value == 0x20008025) {
      value._7_1_ = ON_WindowsBitmap::ReadCompressed(&this->m_PreviewImage,_tcode);
    }
    else if ((int)value == 0x20008027) {
      value._7_1_ = ON_BinaryArchive::ReadString(_tcode,&this->m_3dmArchiveFullPathName);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_tcode);
    if (!bVar1) {
      value._7_1_ = 0;
    }
    if (((value._7_1_ & 1) == 0) || ((int)value == -1)) break;
  }
  return (bool)(value._7_1_ & 1);
}

Assistant:

bool ON_3dmProperties::Read(ON_BinaryArchive& file )
{
  *this = ON_3dmProperties::Empty;

  bool rc = true;

  unsigned int tcode;
  ON__INT64 value;

  for(;;) 
  {

    rc = file.BeginRead3dmBigChunk( &tcode, &value );
    if ( !rc )
      break;

    switch(tcode) 
    {

    case TCODE_PROPERTIES_OPENNURBS_VERSION:
      { 
        unsigned int opennurbs_version = 0;
        if ( value > 0 && value <= 0xFFFFFFFFll)
        {
          opennurbs_version = (unsigned int)((ON__UINT64)value);
        }

        if (    !ON_VersionNumberIsValid(opennurbs_version)
             && !ON_VersionNumberIsYearMonthDateFormat(file.Archive3dmVersion(),opennurbs_version)
           )
        {
          ON_ERROR("ON_3dmProperties::Read - TCODE_PROPERTIES_OPENNURBS_VERSION corrupt value");
          rc = false;
        }

        ON_SetBinaryArchiveOpenNURBSVersion(file,opennurbs_version);
      }
      break;

    case TCODE_PROPERTIES_AS_FILE_NAME:
      rc = file.ReadString(m_3dmArchiveFullPathName);
      break;
      
    case TCODE_PROPERTIES_REVISIONHISTORY: // file creation/revision information
      rc = m_RevisionHistory.Read(file);
      break;
      
    case TCODE_PROPERTIES_NOTES: // file notes
      rc = m_Notes.Read(file);
      break;
      
    case TCODE_PROPERTIES_PREVIEWIMAGE: // uncompressed preview image
      rc = m_PreviewImage.ReadUncompressed(file);
      break;
      
    case TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE: // compressed preview image
      rc = m_PreviewImage.ReadCompressed(file);
      break;
      
    case TCODE_PROPERTIES_APPLICATION: // application that created 3dm file
      rc = m_Application.Read(file);
      break;
      
    default:
      // information added in future will be skipped by file.EndRead3dmChunk()
      break;
    }

    if ( !file.EndRead3dmChunk() )
      rc = false;

    if (!rc)
      break;

    if ( TCODE_ENDOFTABLE == tcode )
      break;
  }

  return rc;
}